

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

int Acb_ObjPushToFanins(Acb_Ntk_t *p,int iObj,int nLutSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  word wVar6;
  int k;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = Acb_ObjFaninNum(p,iObj);
  iVar8 = 0;
  if (1 < iVar1) {
    piVar4 = Acb_ObjFanins(p,iObj);
    lVar10 = 0;
    while (lVar9 = lVar10, lVar9 < *piVar4) {
      lVar10 = lVar9 + 1;
      iVar8 = piVar4[lVar9 + 1];
      iVar1 = Acb_ObjIsCi(p,iVar8);
      if (((iVar1 == 0) && (iVar1 = Acb_ObjFanoutNum(p,iVar8), iVar1 < 2)) &&
         (iVar1 = Acb_ObjFaninNum(p,iVar8), iVar1 != nLutSize)) {
        piVar5 = Acb_ObjFanins(p,iObj);
        for (lVar7 = 0; iVar1 = (int)lVar7, iVar1 < *piVar5; lVar7 = lVar7 + 1) {
          if (lVar9 != lVar7) {
            wVar6 = Acb_ObjTruth(p,iObj);
            iVar2 = Abc_TtCheckDsdAnd(wVar6,iVar1,(int)lVar9,(word *)0x0);
            if (-1 < iVar2) {
              Acb_ObjPushToFanin(p,iObj,iVar1,iVar8);
              goto LAB_0031535f;
            }
          }
        }
      }
    }
    iVar1 = Acb_ObjFaninNum(p,iObj);
    iVar8 = 0;
    if ((iVar1 == 2) && (iVar1 = Acb_ObjFanoutNum(p,iObj), iVar1 == 1)) {
      iVar1 = Acb_ObjFanout(p,iObj,k);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      if ((iVar2 == 0) && (iVar2 = Acb_ObjFaninNum(p,iVar1), iVar2 < nLutSize)) {
        piVar4 = Acb_ObjFanins(p,iObj);
        for (iVar8 = 0; iVar2 = -1, iVar8 < *piVar4; iVar8 = iVar8 + 1) {
          wVar6 = Acb_ObjTruth(p,iObj);
          iVar3 = Abc_Tt6CheckOutDec(wVar6,iVar8,(word *)0x0);
          iVar2 = iVar8;
          if (-1 < iVar3) break;
        }
        Acb_ObjPushToFanout(p,iObj,iVar2,iVar1);
LAB_0031535f:
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

int Acb_ObjPushToFanins( Acb_Ntk_t * p, int iObj, int nLutSize )
{
    int k, k2, iFanin, * pFanins;
    if ( Acb_ObjFaninNum(p, iObj) < 2 )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Acb_ObjIsCi(p, iFanin) )
            continue;
        if ( Acb_ObjFanoutNum(p, iFanin) > 1 )
            continue;
        if ( Acb_ObjFaninNum(p, iFanin) == nLutSize )
            continue;
        if ( (k2 = Acb_ObjFindFaninPushableIndex(p, iObj, k)) == -1 )
            continue;
        //printf( "Object %4d : Pushing fanin %d (%d) into fanin %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanin );
        Acb_ObjPushToFanin( p, iObj, k2, iFanin );
        return 1;
    }
    if ( Acb_ObjFaninNum(p, iObj) == 2 && Acb_ObjFanoutNum(p, iObj) == 1 )
    {
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        if ( !Acb_ObjIsCo(p, iFanout) && Acb_ObjFaninNum(p, iFanout) < nLutSize )
        {
            k2 = Acb_ObjFindFanoutPushableIndex( p, iObj );
            //printf( "Object %4d : Pushing fanin %d (%d) into fanout %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanout );
            Acb_ObjPushToFanout( p, iObj, k2, iFanout );
            return 1;
        }
    }
    return 0;
}